

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

unsigned_long gf2_matrix_times(unsigned_long *mat,unsigned_long vec)

{
  undefined8 local_20;
  unsigned_long sum;
  unsigned_long vec_local;
  unsigned_long *mat_local;
  
  local_20 = 0;
  vec_local = (unsigned_long)mat;
  for (sum = vec; sum != 0; sum = sum >> 1) {
    if ((sum & 1) != 0) {
      local_20 = *(ulong *)vec_local ^ local_20;
    }
    vec_local = vec_local + 8;
  }
  return local_20;
}

Assistant:

local unsigned long gf2_matrix_times(mat, vec)
    unsigned long *mat;
    unsigned long vec;
{
    unsigned long sum;

    sum = 0;
    while (vec) {
        if (vec & 1)
            sum ^= *mat;
        vec >>= 1;
        mat++;
    }
    return sum;
}